

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_atomic_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool bVar1;
  CompilerError *pCVar2;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar3;
  undefined1 local_128 [32];
  undefined1 local_108 [64];
  _Node_iterator_base<unsigned_int,_false> local_c8;
  char local_c0;
  allocator local_b1;
  string local_b0 [38];
  char local_8a;
  allocator local_89;
  string local_88 [35];
  char local_65;
  allocator local_51;
  string local_50 [32];
  SPIRType *local_30;
  SPIRType *type;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  local_30 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  bVar1 = type_is_floating_point(local_30);
  if (bVar1) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      local_65 = '\x01';
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_50,"Floating point atomics requires Vulkan semantics.",&local_51);
      CompilerError::CompilerError(pCVar2,(string *)local_50);
      local_65 = '\0';
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).es & 1U) != 0) {
      local_8a = '\x01';
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_88,"Floating point atomics requires desktop GLSL.",&local_89);
      CompilerError::CompilerError(pCVar2,(string *)local_88);
      local_8a = '\0';
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b0,"GL_EXT_shader_atomic_float",&local_b1);
    require_extension_internal(this,(string *)local_b0);
    ::std::__cxx11::string::~string(local_b0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  pVar3 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(&(this->super_Compiler).forced_temporaries,&op1_local);
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  local_c8._M_cur = (__node_type *)pVar3.first.super__Node_iterator_base<unsigned_int,_false>._M_cur
  ;
  local_c0 = pVar3.second;
  to_non_uniform_aware_expression_abi_cxx11_((CompilerGLSL *)local_108,(uint32_t)this);
  to_unpacked_expression_abi_cxx11_
            ((CompilerGLSL *)local_128,(uint32_t)this,SUB41((uint32_t)op_local,0));
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            ((spirv_cross *)(local_108 + 0x20),(char **)&type,(char (*) [2])0x5cba12,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
             (char (*) [3])0x5cb8ef,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
             (char (*) [2])0x5b48c4);
  emit_op(this,result_type_00,result_id_00,(string *)(local_108 + 0x20),false,false);
  ::std::__cxx11::string::~string((string *)(local_108 + 0x20));
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::~string((string *)local_108);
  Compiler::flush_all_atomic_capable_variables(&this->super_Compiler);
  return;
}

Assistant:

void CompilerGLSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op)
{
	auto &type = get<SPIRType>(result_type);
	if (type_is_floating_point(type))
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Floating point atomics requires Vulkan semantics.");
		if (options.es)
			SPIRV_CROSS_THROW("Floating point atomics requires desktop GLSL.");
		require_extension_internal("GL_EXT_shader_atomic_float");
	}

	forced_temporaries.insert(result_id);
	emit_op(result_type, result_id,
	        join(op, "(", to_non_uniform_aware_expression(op0), ", ",
	             to_unpacked_expression(op1), ")"), false);
	flush_all_atomic_capable_variables();
}